

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_tests.cpp
# Opt level: O0

void __thiscall system_tests::run_command::test_method(run_command *this)

{
  string_view key;
  string_view key_00;
  bool bVar1;
  long in_FS_OFFSET;
  UniValue *success_1;
  runtime_error *ex_3;
  runtime_error *ex_2;
  runtime_error *ex_1;
  CalledProcessError *ex;
  UniValue *success;
  UniValue result_2;
  string command_2;
  string expected_1;
  string command_1;
  string command;
  string expected;
  UniValue result_1;
  UniValue result;
  char *in_stack_fffffffffffff0d8;
  UniValue *in_stack_fffffffffffff0e0;
  assertion_result *in_stack_fffffffffffff0e8;
  char *in_stack_fffffffffffff0f0;
  undefined6 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0fe;
  undefined1 in_stack_fffffffffffff0ff;
  UniValue *in_stack_fffffffffffff100;
  size_t in_stack_fffffffffffff108;
  size_t line_num;
  undefined7 in_stack_fffffffffffff110;
  undefined1 in_stack_fffffffffffff117;
  lazy_ostream *in_stack_fffffffffffff118;
  undefined7 in_stack_fffffffffffff120;
  undefined1 in_stack_fffffffffffff127;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff128;
  undefined7 in_stack_fffffffffffff190;
  undefined1 in_stack_fffffffffffff197;
  string *in_stack_fffffffffffff198;
  undefined1 local_c22 [114];
  lazy_ostream local_bb0 [2];
  assertion_result local_b90 [3];
  const_string local_b48 [2];
  lazy_ostream local_b28 [2];
  assertion_result local_b08 [2];
  allocator<char> local_aca;
  allocator<char> local_ac9 [113];
  const_string local_a58;
  lazy_ostream local_a48 [2];
  assertion_result local_a28 [2];
  allocator<char> local_9e9 [40];
  allocator<char> local_9c1 [121];
  const_string local_948;
  lazy_ostream local_938 [2];
  assertion_result local_918 [2];
  allocator<char> local_8d9 [39];
  allocator<char> local_8b2;
  allocator<char> local_8b1 [113];
  const_string local_840;
  lazy_ostream local_830 [2];
  assertion_result local_810 [2];
  allocator<char> local_7d1 [40];
  allocator<char> local_7a9 [105];
  const_string local_740;
  lazy_ostream local_730 [2];
  assertion_result local_710 [2];
  allocator<char> local_6d2;
  allocator<char> local_6d1 [38];
  allocator<char> local_6ab;
  undefined1 local_6aa [114];
  lazy_ostream local_638 [2];
  assertion_result local_618 [3];
  const_string local_5d0 [2];
  lazy_ostream local_5b0 [2];
  assertion_result local_590 [2];
  allocator<char> local_552;
  allocator<char> local_551;
  const_string local_550 [2];
  lazy_ostream local_530 [2];
  assertion_result local_510 [2];
  allocator<char> local_4d2;
  allocator<char> local_4d1 [1225];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  RunCommandParseJSON(in_stack_fffffffffffff198,
                      (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::~allocator(&local_4d2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::~allocator(local_4d1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    UniValue::isNull((UniValue *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    in_stack_fffffffffffff0d8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_530,local_550,0x19,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  RunCommandParseJSON(in_stack_fffffffffffff198,
                      (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::~allocator(&local_552);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::~allocator(&local_551);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    UniValue::isObject((UniValue *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    in_stack_fffffffffffff0d8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_590,local_5b0,local_5d0,0x1d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffff0ff,
                      CONCAT16(in_stack_fffffffffffff0fe,in_stack_fffffffffffff0f8)),
             in_stack_fffffffffffff0f0);
  key._M_len._7_1_ = in_stack_fffffffffffff127;
  key._M_len._0_7_ = in_stack_fffffffffffff120;
  key._M_str = (char *)in_stack_fffffffffffff128;
  UniValue::find_value(in_stack_fffffffffffff100,key);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    UniValue::isNull((UniValue *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    in_stack_fffffffffffff0d8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_618,local_638,(const_string *)(local_6aa + 0x52),0x1f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,(char (*) [1])in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    local_6aa[1] = UniValue::get_bool(in_stack_fffffffffffff0e0);
    local_6aa[0] = VOBJ;
    in_stack_fffffffffffff0e8 = (assertion_result *)0x1e7be87;
    in_stack_fffffffffffff0e0 = (UniValue *)local_6aa;
    in_stack_fffffffffffff0d8 = "success.get_bool()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_6aa + 0x12,local_6aa + 2,0x20,1,2,local_6aa + 1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::~allocator(&local_6ab);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff128,
               (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
               (allocator<char> *)in_stack_fffffffffffff118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff128,
               (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
               (allocator<char> *)in_stack_fffffffffffff118);
    RunCommandParseJSON(in_stack_fffffffffffff198,
                        (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0d8);
    std::allocator<char>::~allocator(&local_6d2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0d8);
    std::allocator<char>::~allocator(local_6d1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff118,
                 (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
                 in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0e0,(char (*) [65])in_stack_fffffffffffff0d8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      in_stack_fffffffffffff0d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_710,local_730,&local_740,0x25,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[65],_const_char_(&)[65]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[65],_const_char_(&)[65]>
                          *)in_stack_fffffffffffff0d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff0d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::~allocator(local_7a9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff128,
               (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
               (allocator<char> *)in_stack_fffffffffffff118);
    RunCommandParseJSON(in_stack_fffffffffffff198,
                        (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0d8);
    std::allocator<char>::~allocator(local_7d1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff118,
                 (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
                 in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0e0,(char (*) [53])in_stack_fffffffffffff0d8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      in_stack_fffffffffffff0d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_810,local_830,&local_840,0x2e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff0d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff0d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::~allocator(local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::~allocator(&local_8b2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff128,
               (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
               (allocator<char> *)in_stack_fffffffffffff118);
    RunCommandParseJSON(in_stack_fffffffffffff198,
                        (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0d8);
    std::allocator<char>::~allocator(local_8d9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff118,
                 (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
                 in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0e0,(char (*) [53])in_stack_fffffffffffff0d8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      in_stack_fffffffffffff0d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_918,local_938,&local_948,0x39,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff0d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff0d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::~allocator(local_9c1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff128,
               (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
               (allocator<char> *)in_stack_fffffffffffff118);
    RunCommandParseJSON(in_stack_fffffffffffff198,
                        (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0d8);
    std::allocator<char>::~allocator(local_9e9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff118,
                 (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
                 in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
      in_stack_fffffffffffff198 = (string *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0e0,(char (*) [53])in_stack_fffffffffffff0d8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
                 (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
      in_stack_fffffffffffff0d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_a28,local_a48,&local_a58,0x3e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff0d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff0d8);
      in_stack_fffffffffffff197 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff197);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,
             (char *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120),
             (allocator<char> *)in_stack_fffffffffffff118);
  RunCommandParseJSON(in_stack_fffffffffffff198,
                      (string *)CONCAT17(in_stack_fffffffffffff197,in_stack_fffffffffffff190));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::~allocator(&local_aca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8);
  std::allocator<char>::~allocator(local_ac9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    UniValue::isObject((UniValue *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    in_stack_fffffffffffff0d8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b08,local_b28,local_b48,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffff0ff,
                      CONCAT16(in_stack_fffffffffffff0fe,in_stack_fffffffffffff0f8)),
             in_stack_fffffffffffff0f0);
  key_00._M_len._7_1_ = in_stack_fffffffffffff127;
  key_00._M_len._0_7_ = in_stack_fffffffffffff120;
  key_00._M_str = (char *)in_stack_fffffffffffff128;
  UniValue::find_value(in_stack_fffffffffffff100,key_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               in_stack_fffffffffffff108,(const_string *)in_stack_fffffffffffff100);
    UniValue::isNull((UniValue *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff0e8,SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0));
    in_stack_fffffffffffff118 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    in_stack_fffffffffffff0d8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b90,local_bb0,(const_string *)(local_c22 + 0x52),0x45,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0d8);
    in_stack_fffffffffffff117 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff117);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff118,
               (const_string *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),
               line_num,(const_string *)in_stack_fffffffffffff100);
    in_stack_fffffffffffff100 = (UniValue *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0e0,(char (*) [1])in_stack_fffffffffffff0d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0e8,
               (pointer)in_stack_fffffffffffff0e0,(unsigned_long)in_stack_fffffffffffff0d8);
    local_c22[1] = UniValue::get_bool(in_stack_fffffffffffff0e0);
    local_c22[0] = VOBJ;
    in_stack_fffffffffffff0e8 = (assertion_result *)0x1e7be87;
    in_stack_fffffffffffff0e0 = (UniValue *)local_c22;
    in_stack_fffffffffffff0d8 = "success.get_bool()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_c22 + 0x12,local_c22 + 2,0x46,1,2,local_c22 + 1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff0d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(run_command)
{
    {
        const UniValue result = RunCommandParseJSON("");
        BOOST_CHECK(result.isNull());
    }
    {
        const UniValue result = RunCommandParseJSON("echo {\"success\": true}");
        BOOST_CHECK(result.isObject());
        const UniValue& success = result.find_value("success");
        BOOST_CHECK(!success.isNull());
        BOOST_CHECK_EQUAL(success.get_bool(), true);
    }
    {
        // An invalid command is handled by cpp-subprocess
        const std::string expected{"execve failed: "};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON("invalid_command"), subprocess::CalledProcessError, HasReason(expected));
    }
    {
        // Return non-zero exit code, no output to stderr
        const std::string command{"false"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, [&](const std::runtime_error& e) {
            const std::string what{e.what()};
            BOOST_CHECK(what.find(strprintf("RunCommandParseJSON error: process(%s) returned 1: \n", command)) != std::string::npos);
            return true;
        });
    }
    {
        // Return non-zero exit code, with error message for stderr
        const std::string command{"sh -c 'echo err 1>&2 && false'"};
        const std::string expected{"err"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, [&](const std::runtime_error& e) {
            const std::string what(e.what());
            BOOST_CHECK(what.find(strprintf("RunCommandParseJSON error: process(%s) returned", command)) != std::string::npos);
            BOOST_CHECK(what.find(expected) != std::string::npos);
            return true;
        });
    }
    {
        // Unable to parse JSON
        const std::string command{"echo {"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, HasReason("Unable to parse JSON: {"));
    }
    // Test std::in
    {
        const UniValue result = RunCommandParseJSON("cat", "{\"success\": true}");
        BOOST_CHECK(result.isObject());
        const UniValue& success = result.find_value("success");
        BOOST_CHECK(!success.isNull());
        BOOST_CHECK_EQUAL(success.get_bool(), true);
    }
}